

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

bool __thiscall rw::Material::streamWrite(Material *this,Stream *stream)

{
  int32 size;
  uint32 size_00;
  undefined8 local_48;
  float32 local_40;
  undefined4 local_38;
  RGBA local_34;
  undefined4 local_30;
  uint local_2c;
  
  size_00 = streamGetSize(this);
  writeChunkHeader(stream,7,size_00);
  size = 0x1c;
  if (version < 0x30400) {
    size = 0x10;
  }
  writeChunkHeader(stream,1,size);
  local_34 = this->color;
  local_38 = 0;
  local_30 = 0;
  local_2c = (uint)(this->texture != (Texture *)0x0);
  (*stream->_vptr_Stream[3])(stream,&local_38,0x10);
  if (0x303ff < version) {
    local_48._0_4_ = (this->surfaceProps).ambient;
    local_48._4_4_ = (this->surfaceProps).specular;
    local_40 = (this->surfaceProps).diffuse;
    Stream::write32(stream,&local_48,0xc);
  }
  if (this->texture != (Texture *)0x0) {
    Texture::streamWrite(this->texture,stream);
  }
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return true;
}

Assistant:

bool
Material::streamWrite(Stream *stream)
{
	MatStreamData buf;

	writeChunkHeader(stream, ID_MATERIAL, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, sizeof(MatStreamData)
		+ (rw::version >= 0x30400 ? 12 : 0));

	buf.color = this->color;
	buf.flags = 0;
	buf.unused = 0;
	buf.textured = this->texture != nil;
	memLittle32(&buf, sizeof(buf));
	buf.color = this->color;
	stream->write8(&buf, sizeof(buf));

	if(rw::version >= 0x30400){
		float32 surfaceProps[3];
		surfaceProps[0] = this->surfaceProps.ambient;
		surfaceProps[1] = this->surfaceProps.specular;
		surfaceProps[2] = this->surfaceProps.diffuse;
		stream->write32(surfaceProps, sizeof(surfaceProps));
	}

	if(this->texture)
		this->texture->streamWrite(stream);

	s_plglist.streamWrite(stream, this);
	return true;
}